

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O3

void __thiscall boost::unit_test::decorator::collector::~collector(collector *this)

{
  pointer psVar1;
  pointer psVar2;
  
  psVar2 = (this->m_tu_decorators).
           super__Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_tu_decorators).
           super__Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      detail::shared_count::~shared_count(&psVar2->pn);
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
    psVar2 = (this->m_tu_decorators).
             super__Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)(this->m_tu_decorators).
                                 super__Vector_base<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar2);
    return;
  }
  return;
}

Assistant:

class BOOST_TEST_DECL collector : public singleton<collector> {
public:
    collector&              operator*( base const& d );

    void                    store_in( test_unit& tu );

    void                    reset();

private:
    BOOST_TEST_SINGLETON_CONS( collector )

    // Data members
    std::vector<base_ptr>   m_tu_decorators;
}